

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPPacket::BuildPacket
          (RTPPacket *this,uint8_t payloadtype,void *payloaddata,size_t payloadlen,uint16_t seqnr,
          uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,uint32_t *csrcs,
          bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,void *extensiondata,
          void *buffer,size_t maxsize)

{
  uint uVar1;
  RTPMemoryManager *pRVar2;
  ushort uVar3;
  int iVar4;
  uint8_t *puVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ushort *puVar10;
  ushort uVar11;
  
  iVar4 = -0x1a;
  if ((numcsrcs < 0x10) && (iVar4 = -0x15, (payloadtype & 0x7e) != 0x48 && -1 < (char)payloadtype))
  {
    uVar7 = (ulong)((uint)numcsrcs * 4 & 0xff);
    lVar8 = uVar7 + (ulong)extensionlen_numwords * 4 + 0x10;
    if (!gotextension) {
      lVar8 = uVar7 + 0xc;
    }
    uVar9 = lVar8 + payloadlen;
    this->packetlength = uVar9;
    if ((maxsize == 0) || (uVar9 <= maxsize)) {
      if (buffer == (void *)0x0) {
        pRVar2 = (this->super_RTPMemoryObject).mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          puVar5 = (uint8_t *)operator_new__(uVar9);
        }
        else {
          puVar5 = (uint8_t *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,uVar9,8);
        }
        this->packet = puVar5;
        if (puVar5 == (uint8_t *)0x0) {
          this->packetlength = 0;
          return -1;
        }
        bVar6 = false;
      }
      else {
        this->packet = (uint8_t *)buffer;
        bVar6 = true;
      }
      this->externalbuffer = bVar6;
      this->hasmarker = gotmarker;
      this->hasextension = gotextension;
      this->numcsrcs = (uint)numcsrcs;
      this->payloadtype = payloadtype;
      this->extseqnr = (uint)seqnr;
      this->timestamp = timestamp;
      this->ssrc = ssrc;
      this->payloadlength = payloadlen;
      this->extid = extensionid;
      this->extensionlength = (ulong)extensionlen_numwords * 4;
      puVar10 = (ushort *)this->packet;
      uVar11 = ((ushort)(byte)~gotmarker << 0xf | *puVar10 & 0x7f1f) + 0x8080;
      uVar3 = uVar11 | 0x10;
      if (!gotextension) {
        uVar3 = uVar11 & 0x8080;
      }
      *puVar10 = CONCAT11(payloadtype,numcsrcs) | uVar3 & 0x8090;
      puVar10[1] = seqnr << 8 | seqnr >> 8;
      *(uint32_t *)(puVar10 + 2) =
           timestamp >> 0x18 | (timestamp & 0xff0000) >> 8 | (timestamp & 0xff00) << 8 |
           timestamp << 0x18;
      *(uint32_t *)(puVar10 + 4) =
           ssrc >> 0x18 | (ssrc & 0xff0000) >> 8 | (ssrc & 0xff00) << 8 | ssrc << 0x18;
      puVar5 = this->packet;
      if (numcsrcs != '\0') {
        uVar9 = 0;
        do {
          uVar1 = csrcs[uVar9];
          *(uint *)(puVar5 + uVar9 * 4 + 0xc) =
               uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          uVar9 = uVar9 + 1;
        } while (numcsrcs != uVar9);
      }
      puVar10 = (ushort *)(puVar5 + uVar7 + 0xc);
      this->payload = (uint8_t *)puVar10;
      if (gotextension) {
        *puVar10 = extensionid << 8 | extensionid >> 8;
        puVar10[1] = extensionlen_numwords << 8 | extensionlen_numwords >> 8;
        this->payload = (uint8_t *)(puVar10 + 2);
        memcpy(puVar10 + 2,extensiondata,this->extensionlength);
        this->payload = this->payload + this->extensionlength;
      }
      memcpy(this->payload,payloaddata,payloadlen);
      iVar4 = 0;
    }
    else {
      this->packetlength = 0;
      iVar4 = -0x16;
    }
  }
  return iVar4;
}

Assistant:

int RTPPacket::BuildPacket(uint8_t payloadtype,const void *payloaddata,size_t payloadlen,uint16_t seqnr,
		  uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,const uint32_t *csrcs,
		  bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,const void *extensiondata,
		  void *buffer,size_t maxsize)
{
	if (numcsrcs > RTP_MAXCSRCS)
		return ERR_RTP_PACKET_TOOMANYCSRCS;

	if (payloadtype > 127) // high bit should not be used
		return ERR_RTP_PACKET_BADPAYLOADTYPE;
	if (payloadtype == 72 || payloadtype == 73) // could cause confusion with rtcp types
		return ERR_RTP_PACKET_BADPAYLOADTYPE;
	
	packetlength = sizeof(RTPHeader);
	packetlength += sizeof(uint32_t)*((size_t)numcsrcs);
	if (gotextension)
	{
		packetlength += sizeof(RTPExtensionHeader);
		packetlength += sizeof(uint32_t)*((size_t)extensionlen_numwords);
	}
	packetlength += payloadlen;

	if (maxsize > 0 && packetlength > maxsize)
	{
		packetlength = 0;
		return ERR_RTP_PACKET_DATAEXCEEDSMAXSIZE;
	}

	// Ok, now we'll just fill in...
	
	RTPHeader *rtphdr;
	
	if (buffer == 0)
	{
		packet = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKET) uint8_t [packetlength];
		if (packet == 0)
		{
			packetlength = 0;
			return ERR_RTP_OUTOFMEM;
		}
		externalbuffer = false;
	}
	else
	{
		packet = (uint8_t *)buffer;
		externalbuffer = true;
	}
	
	RTPPacket::hasmarker = gotmarker;
	RTPPacket::hasextension = gotextension;
	RTPPacket::numcsrcs = numcsrcs;
	RTPPacket::payloadtype = payloadtype;
	RTPPacket::extseqnr = (uint32_t)seqnr;
	RTPPacket::timestamp = timestamp;
	RTPPacket::ssrc = ssrc;
	RTPPacket::payloadlength = payloadlen;
	RTPPacket::extid = extensionid;
	RTPPacket::extensionlength = ((size_t)extensionlen_numwords)*sizeof(uint32_t);
	
	rtphdr = (RTPHeader *)packet;
	rtphdr->version = RTP_VERSION;
	rtphdr->padding = 0;
	if (gotmarker)
		rtphdr->marker = 1;
	else
		rtphdr->marker = 0;
	if (gotextension)
		rtphdr->extension = 1;
	else
		rtphdr->extension = 0;
	rtphdr->csrccount = numcsrcs;
	rtphdr->payloadtype = payloadtype&127; // make sure high bit isn't set
	rtphdr->sequencenumber = htons(seqnr);
	rtphdr->timestamp = htonl(timestamp);
	rtphdr->ssrc = htonl(ssrc);
	
	uint32_t *curcsrc;
	int i;

	curcsrc = (uint32_t *)(packet+sizeof(RTPHeader));
	for (i = 0 ; i < numcsrcs ; i++,curcsrc++)
		*curcsrc = htonl(csrcs[i]);

	payload = packet+sizeof(RTPHeader)+((size_t)numcsrcs)*sizeof(uint32_t); 
	if (gotextension)
	{
		RTPExtensionHeader *rtpexthdr = (RTPExtensionHeader *)payload;

		rtpexthdr->extid = htons(extensionid);
		rtpexthdr->length = htons((uint16_t)extensionlen_numwords);
		
		payload += sizeof(RTPExtensionHeader);
		memcpy(payload,extensiondata,RTPPacket::extensionlength);
		
		payload += RTPPacket::extensionlength;
	}
	memcpy(payload,payloaddata,payloadlen);
	return 0;
}